

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall TTD::MarkTable::Grow(MarkTable *this)

{
  int32 iVar1;
  Memory *pMVar2;
  unsigned_long *puVar3;
  MarkTableTag *pMVar4;
  uint local_a4;
  int32 idx;
  uint32 i;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  uint32 local_30 [2];
  uint32 dummyNearPrime;
  uint32 dummyPowerOf2;
  MarkTableTag *oldMarkArray;
  uint64 *oldAddrArray;
  MarkTable *pMStack_10;
  uint32 oldCapacity;
  MarkTable *this_local;
  
  oldAddrArray._4_4_ = this->m_capcity;
  oldMarkArray = (MarkTableTag *)this->m_addrArray;
  _dummyNearPrime = this->m_markArray;
  this->m_capcity = this->m_capcity * 2;
  local_30[1] = 0;
  local_30[0] = 0;
  pMStack_10 = this;
  LoadValuesForHashTables(this->m_capcity,local_30 + 1,local_30,&this->m_h2Prime);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&unsigned_long::typeinfo,0,(ulong)this->m_capcity,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x577);
  pMVar2 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_58);
  local_68 = Memory::HeapAllocator::NoThrowAllocZero;
  local_60 = 0;
  puVar3 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_long,true>
                     (pMVar2,(HeapAllocator *)Memory::HeapAllocator::NoThrowAllocZero,0,
                      (ulong)this->m_capcity);
  puVar3 = TTD_MEM_ALLOC_CHECK<unsigned_long>(puVar3);
  this->m_addrArray = puVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&MarkTableTag::typeinfo,0,(ulong)this->m_capcity,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x578);
  pMVar2 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_90);
  pMVar4 = Memory::AllocateArray<Memory::HeapAllocator,TTD::MarkTableTag,true>
                     (pMVar2,(HeapAllocator *)Memory::HeapAllocator::NoThrowAllocZero,0,
                      (ulong)this->m_capcity);
  pMVar4 = TTD_MEM_ALLOC_CHECK<TTD::MarkTableTag>(pMVar4);
  this->m_markArray = pMVar4;
  for (local_a4 = 0; local_a4 < oldAddrArray._4_4_; local_a4 = local_a4 + 1) {
    iVar1 = FindIndexForKey(this,*(undefined8 *)(oldMarkArray + (ulong)local_a4 * 8));
    this->m_addrArray[iVar1] = *(undefined8 *)(oldMarkArray + (ulong)local_a4 * 8);
    this->m_markArray[iVar1] = _dummyNearPrime[local_a4];
  }
  Memory::DeleteArray<Memory::HeapAllocator,unsigned_long>
            (&Memory::HeapAllocator::Instance,(ulong)oldAddrArray._4_4_,
             (unsigned_long *)oldMarkArray);
  Memory::DeleteArray<Memory::HeapAllocator,TTD::MarkTableTag>
            (&Memory::HeapAllocator::Instance,(ulong)oldAddrArray._4_4_,_dummyNearPrime);
  return;
}

Assistant:

void Grow()
        {
            uint32 oldCapacity = this->m_capcity;
            uint64* oldAddrArray = this->m_addrArray;
            MarkTableTag* oldMarkArray = this->m_markArray;

            this->m_capcity = this->m_capcity << 1; //double capacity

            uint32 dummyPowerOf2 = 0;
            uint32 dummyNearPrime = 0;
            LoadValuesForHashTables(this->m_capcity, &dummyPowerOf2, &dummyNearPrime, &(this->m_h2Prime));

            this->m_addrArray = TT_HEAP_ALLOC_ARRAY_ZERO(uint64, this->m_capcity);
            this->m_markArray = TT_HEAP_ALLOC_ARRAY_ZERO(MarkTableTag, this->m_capcity);

            for (uint32 i = 0; i < oldCapacity; ++i)
            {
                int32 idx = this->FindIndexForKey(oldAddrArray[i]);
                this->m_addrArray[idx] = oldAddrArray[i];
                this->m_markArray[idx] = oldMarkArray[i];
            }

            TT_HEAP_FREE_ARRAY(uint64, oldAddrArray, oldCapacity);
            TT_HEAP_FREE_ARRAY(MarkTableTag, oldMarkArray, oldCapacity);
        }